

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::AmbiguousCastOrBinaryExpression
          (DiagnosticsReporter *this,AmbiguousCastOrBinaryExpressionSyntax *node)

{
  SyntaxToken *this_00;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  DiagnosticDescriptor local_f0;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string s;
  AmbiguousCastOrBinaryExpressionSyntax *node_local;
  DiagnosticsReporter *this_local;
  
  s.field_2._8_8_ = node;
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_78,this_00);
  std::operator+(&local_58,"ambiguous cast or binary expression `",&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"\'");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string
            (local_110,(string *)&ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"[[ambiguous cast or binary expression]]",&local_131);
  std::__cxx11::string::string(local_158,(string *)local_38);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_f0,local_110,local_130,local_158,2,1);
  retainAmbiguityDiagnostic(this,&local_f0,(SyntaxNode *)s.field_2._8_8_);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_f0);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::AmbiguousCastOrBinaryExpression(
        const AmbiguousCastOrBinaryExpressionSyntax* node)
{
    std::string s = "ambiguous cast or binary expression `"
            + parser_->peek().valueText()
            + "'";

    retainAmbiguityDiagnostic(
                DiagnosticDescriptor(ID_of_AmbiguousCastOrBinaryExpression,
                                     "[[ambiguous cast or binary expression]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax),
                node);
}